

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lista_tests.cpp
# Opt level: O3

void __thiscall
lista_test_test_lista_de_lista_Test::~lista_test_test_lista_de_lista_Test
          (lista_test_test_lista_de_lista_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(lista_test, test_lista_de_lista) {
    Lista<int> l;
    l.agregarAtras(42);
    l.agregarAtras(43);
    l.agregarAtras(44);
    l.agregarAtras(45);

    Lista<Lista<int> > ll;
    ll.agregarAtras(l);
    ll.agregarAtras(l);
    ll.agregarAtras(l);

    // test aliasing entre lista original y copias
    l.eliminar(0);
    ASSERT_EQ(ll.iesimo(0).longitud(), 4);

    // test aliasing entre elementos de lista
    ll.iesimo(0).eliminar(0);
    ASSERT_EQ(ll.iesimo(1).longitud(), 4);
}